

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O1

void shared_ownership(shared_ptr<A> *s_ptr)

{
  ostream *poVar1;
  char local_21;
  shared_ptr<A> local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Took ownership of: ",0x13);
  poVar1 = operator<<((ostream *)&std::cout,
                      (s_ptr->super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_21 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"use_count: ",0xb);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  local_21 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  local_20.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (s_ptr->super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (s_ptr->super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           (local_20.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           (local_20.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  shared_ownership2(&local_20);
  if (local_20.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"use_count: ",0xb);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  local_21 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  return;
}

Assistant:

void shared_ownership(std::shared_ptr<A> s_ptr)
{
    std::cout << "Took ownership of: " << *s_ptr << '\n';
    std::cout << "use_count: " << s_ptr.use_count() << '\n';
    shared_ownership2(s_ptr);
    std::cout << "use_count: " << s_ptr.use_count() << '\n';
}